

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TPZChunkVector.h
# Opt level: O3

void __thiscall
TPZChunkVector<TPZCompEl_*,_10>::TPZChunkVector
          (TPZChunkVector<TPZCompEl_*,_10> *this,void **vtt,TPZChunkVector<TPZCompEl_*,_10> *TCh)

{
  long lVar1;
  TPZCompEl **ppTVar2;
  TPZCompEl **ppTVar3;
  long lVar4;
  long lVar5;
  
  (this->super_TPZSavable)._vptr_TPZSavable = (_func_int **)vtt[1];
  (this->super_TPZSavable)._vptr_TPZSavable = (_func_int **)*vtt;
  TPZManVector<TPZCompEl_**,_10>::TPZManVector
            (&this->fVec,(TCh->fVec).super_TPZVec<TPZCompEl_**>.fNElements);
  this->fNElements = TCh->fNElements;
  lVar1 = (TCh->fVec).super_TPZVec<TPZCompEl_**>.fNElements;
  if (0 < lVar1) {
    lVar5 = 0;
    do {
      if ((TCh->fVec).super_TPZVec<TPZCompEl_**>.fStore[lVar5] == (TPZCompEl **)0x0) {
        (this->fVec).super_TPZVec<TPZCompEl_**>.fStore[lVar5] = (TPZCompEl **)0x0;
      }
      else {
        ppTVar3 = (TPZCompEl **)operator_new__(0x2000);
        (this->fVec).super_TPZVec<TPZCompEl_**>.fStore[lVar5] = ppTVar3;
        ppTVar2 = (TCh->fVec).super_TPZVec<TPZCompEl_**>.fStore[lVar5];
        lVar4 = 0;
        do {
          ppTVar3[lVar4] = ppTVar2[lVar4];
          lVar4 = lVar4 + 1;
        } while (lVar4 != 0x400);
      }
      lVar5 = lVar5 + 1;
    } while (lVar5 != lVar1);
  }
  return;
}

Assistant:

TPZChunkVector<T, EXP>::TPZChunkVector(const TPZChunkVector<T, EXP> &TCh) :
fVec(TCh.fVec.NElements()) {

    fNElements = TCh.NElements();
    int64_t nchunks = TCh.fVec.NElements();

    for (int64_t i = 0; i < nchunks; i++) {
        if (!TCh.fVec[i]) {
            fVec[i] = NULL;
        } else {
            int64_t j, k = 1 << EXP;
            T* ptr = new T[1 << EXP];
            fVec[i] = ptr;
            T* ptrcp = TCh.fVec[i];
            for (j = 0; j < k; j++) {
                ptr[j] = ptrcp[j];
            }
        }
    }
}